

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

shared_ptr<Pipeline> __thiscall
QPDFLogger::throwIfNull(QPDFLogger *this,shared_ptr<Pipeline> *p,bool null_okay)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  logic_error *this_00;
  int in_ECX;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Pipeline> sVar3;
  
  _Var2._M_pi._1_7_ = in_register_00000011;
  _Var2._M_pi._0_1_ = null_okay;
  if ((in_ECX == 0) && ((_Var2._M_pi)->_vptr__Sp_counted_base == (_func_int **)0x0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"QPDFLogger: requested a null pipeline without null_okay == true");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(_Var2._M_pi)->_vptr__Sp_counted_base;
  (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(_Var2._M_pi)->_M_use_count;
  (_Var2._M_pi)->_M_use_count = 0;
  (_Var2._M_pi)->_M_weak_count = 0;
  (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (_Var2._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  sVar3.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar3.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::throwIfNull(std::shared_ptr<Pipeline> p, bool null_okay)
{
    if (!(null_okay || p)) {
        throw std::logic_error("QPDFLogger: requested a null pipeline without null_okay == true");
    }
    return p;
}